

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginFunctionBody
          (BinaryReaderObjdump *this,Index index,Offset size)

{
  string_view sVar1;
  
  PrintDetails(this," - func[%u] size=%zd",index,size);
  sVar1 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,index);
  if (sVar1.size_ != 0) {
    PrintDetails(this," <%.*s>",sVar1.size_,sVar1.data_);
  }
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginFunctionBody(Index index, Offset size) {
  PrintDetails(" - func[%" PRIindex "] size=%" PRIzd, index, size);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  return Result::Ok;
}